

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mongoose.c
# Opt level: O0

int is_authorized(http_message *hm,char *path,int is_directory,char *domain,char *passwords_file,
                 int is_global_pass_file)

{
  int local_23c;
  FILE *pFStack_238;
  int authorized;
  FILE *fp;
  char *p;
  char buf [500];
  int is_global_pass_file_local;
  char *passwords_file_local;
  char *domain_local;
  int is_directory_local;
  char *path_local;
  http_message *hm_local;
  
  local_23c = 1;
  if ((domain != (char *)0x0) && (passwords_file != (char *)0x0)) {
    buf._492_4_ = is_global_pass_file;
    unique0x10000186 = passwords_file;
    if (is_global_pass_file == 0) {
      if (is_directory == 0) {
        fp = (FILE *)strrchr(path,0x2f);
        if ((fp == (FILE *)0x0) && (fp = (FILE *)strrchr(path,0x5c), fp == (FILE *)0x0)) {
          fp = (FILE *)path;
        }
        snprintf((char *)&p,500,"%.*s/%s",(ulong)(uint)((int)fp - (int)path),path,
                 stack0xffffffffffffffd0);
        pFStack_238 = fopen64((char *)&p,"r");
      }
      else {
        snprintf((char *)&p,500,"%s%c%s",path,0x2f,passwords_file);
        pFStack_238 = fopen64((char *)&p,"r");
      }
    }
    else {
      pFStack_238 = fopen64(passwords_file,"r");
    }
    if (pFStack_238 != (FILE *)0x0) {
      local_23c = mg_http_check_digest_auth(hm,domain,(FILE *)pFStack_238);
      fclose(pFStack_238);
    }
  }
  return local_23c;
}

Assistant:

static int is_authorized(struct http_message *hm, const char *path,
                         int is_directory, const char *domain,
                         const char *passwords_file, int is_global_pass_file) {
    char buf[MAX_PATH_SIZE];
    const char *p;
    FILE *fp;
    int authorized = 1;

    if (domain != NULL && passwords_file != NULL) {
        if (is_global_pass_file) {
            fp = fopen(passwords_file, "r");
        } else if (is_directory) {
            snprintf(buf, sizeof(buf), "%s%c%s", path, DIRSEP, passwords_file);
            fp = fopen(buf, "r");
        } else {
            if ((p = strrchr(path, '/')) == NULL &&
                (p = strrchr(path, '\\')) == NULL) {
                p = path;
            }
            snprintf(buf, sizeof(buf), "%.*s/%s", (int) (p - path), path,
                     passwords_file);
            fp = fopen(buf, "r");
        }

        if (fp != NULL) {
            authorized = mg_http_check_digest_auth(hm, domain, fp);
            fclose(fp);
        }
    }

    return authorized;
}